

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileLockPool.cxx
# Opt level: O3

bool __thiscall cmFileLockPool::ScopePool::IsAlreadyLocked(ScopePool *this,string *filename)

{
  bool bVar1;
  _List_node_base *p_Var2;
  
  p_Var2 = (_List_node_base *)this;
  do {
    p_Var2 = (((List *)&p_Var2->_M_next)->
             super__List_base<cmFileLock_*,_std::allocator<cmFileLock_*>_>)._M_impl._M_node.
             super__List_node_base._M_next;
    if (p_Var2 == (_List_node_base *)this) break;
    bVar1 = cmFileLock::IsLocked(*(cmFileLock **)(p_Var2 + 1),filename);
  } while (!bVar1);
  return p_Var2 != (_List_node_base *)this;
}

Assistant:

bool cmFileLockPool::ScopePool::IsAlreadyLocked(
    const std::string& filename) const
{
  for (CIt i = this->Locks.begin(); i != this->Locks.end(); ++i)
    {
    if ((*i)->IsLocked(filename))
      {
      return true;
      }
    }
  return false;
}